

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O3

void __thiscall SynthWidget::on_detailsButton_clicked(SynthWidget *this)

{
  int iVar1;
  QFrame *pQVar2;
  QIcon *pQVar3;
  int iVar4;
  Master *this_00;
  QSettings *pQVar5;
  long *plVar6;
  long lVar7;
  QSize *pQVar8;
  short sVar9;
  QWidget *p;
  int iVar10;
  bool visible;
  QByteArrayView QVar11;
  QSize newSize;
  QArrayData *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  anon_union_24_3_e3d07ef4_for_data local_50;
  
  pQVar2 = (this->ui->super_Ui_SynthWidget).detailsFrame;
  sVar9 = (short)*(undefined4 *)(*(long *)(pQVar2 + 0x20) + 8);
  visible = -1 < sVar9;
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,visible);
  pQVar3 = (QIcon *)(this->ui->super_Ui_SynthWidget).detailsButton;
  getSynthDetailsIcon(visible);
  QAbstractButton::setIcon(pQVar3);
  this_00 = Master::getInstance();
  pQVar5 = Master::getSettings(this_00);
  QVar11.m_data = (storage_type *)0x17;
  QVar11.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar11);
  local_68 = (QArrayData *)local_50.shared;
  local_60 = local_50._8_8_;
  uStack_58 = local_50._16_8_;
  QVariant::QVariant((QVariant *)&local_50,visible);
  QSettings::setValue((QString *)pQVar5,(QVariant *)&local_68);
  QVariant::~QVariant((QVariant *)&local_50);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  lVar7 = *(long *)((this->ui->super_Ui_SynthWidget).detailsFrame + 0x20);
  iVar10 = *(int *)(lVar7 + 0x20);
  iVar1 = *(int *)(lVar7 + 0x18);
  plVar6 = (long *)QWidget::layout();
  iVar4 = (**(code **)(*plVar6 + 0x60))(plVar6);
  iVar10 = (iVar10 - iVar1) + iVar4 + 1;
  if (sVar9 < 0) {
    do {
      QWidget::updateGeometry();
      this = *(SynthWidget **)(*(long *)&this->field_0x8 + 0x10);
    } while (this != (SynthWidget *)0x0);
    iVar10 = -iVar10;
    QWidget::layout();
    QLayout::activate();
    QWidget::window();
    QWidget::layout();
    QLayout::activate();
  }
  lVar7 = QWidget::window();
  lVar7 = *(long *)(lVar7 + 0x20);
  local_50._4_4_ = (*(int *)(lVar7 + 0x20) - *(int *)(lVar7 + 0x18)) + iVar10 + 1;
  local_50._0_4_ = (*(int *)(lVar7 + 0x1c) - *(int *)(lVar7 + 0x14)) + 1;
  pQVar8 = (QSize *)QWidget::window();
  QWidget::resize(pQVar8);
  return;
}

Assistant:

void SynthWidget::on_detailsButton_clicked() {
	bool newVisible = !ui->detailsFrame->isVisible();
	ui->detailsFrame->setVisible(newVisible);
	ui->detailsButton->setIcon(SynthWidget::getSynthDetailsIcon(newVisible));
	Master::getInstance()->getSettings()->setValue("Master/showSynthDetails", newVisible);

	// Adjust size of main window
	int heightDelta = ui->detailsFrame->height() + layout()->spacing();
	if (!newVisible) {
		heightDelta = -heightDelta;

		// Enforce relayout of widget hierarchy up to the main window to allow its shrinking
		QWidget *p = this;
		while (p != NULL) {
			p->updateGeometry();
			p = p->parentWidget();
		}
		layout()->activate();
		window()->layout()->activate();
	}

	// OK, widgets' layouts updated, now resize main window
	QSize newSize = window()->size();
	newSize.rheight() += heightDelta;
	window()->resize(newSize);
}